

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d.cpp
# Opt level: O0

Image * rw::d3d::rasterToImage(Raster *raster)

{
  int iVar1;
  uint8 *pixels_00;
  FILE *__stream;
  uint uVar2;
  Image *pIVar3;
  char *pcVar4;
  bool bVar5;
  uint8 *rasrow;
  uint8 *imgrow;
  int y;
  int x;
  uint8 *pixels;
  uint8 *imgpixels;
  uint8 *puStack_70;
  int32 i;
  uint8 *out;
  uint8 *in;
  uint32 local_58;
  int32 pallength;
  Error _e;
  _func_void_uint8_ptr_uint8_ptr *conv;
  uint8 *pix;
  int h;
  int w;
  D3dRaster *natras;
  bool unlock;
  Image *image;
  int32 depth;
  Raster *raster_local;
  
  bVar5 = raster->pixels == (uint8 *)0x0;
  if (bVar5) {
    Raster::lock(raster,0,2);
  }
  iVar1 = nativeRasterOffset;
  if ((*(byte *)((long)&raster->stride + (long)nativeRasterOffset + 1) & 1) != 0) {
    pix._4_4_ = raster->width;
    pix._0_4_ = raster->height;
    if (pix._4_4_ < 4) {
      pix._4_4_ = 4;
    }
    if ((int)pix < 4) {
      pix._0_4_ = 4;
    }
    pIVar3 = Image::create(pix._4_4_,(int)pix,0x20);
    Image::allocate(pIVar3);
    pixels_00 = raster->pixels;
    iVar1 = *(int *)((long)&raster->height + (long)iVar1);
    if (iVar1 == 0x31545844) {
      Image::setPixelsDXT(pIVar3,1,pixels_00);
      if ((raster->format & 0xf00U) == 0x200) {
        Image::removeMask(pIVar3);
      }
    }
    else if (iVar1 == 0x33545844) {
      Image::setPixelsDXT(pIVar3,3,pixels_00);
    }
    else {
      if (iVar1 != 0x35545844) {
        Image::destroy(pIVar3);
        if (bVar5) {
          Raster::unlock(raster,0);
        }
        return (Image *)0x0;
      }
      Image::setPixelsDXT(pIVar3,5,pixels_00);
    }
    pIVar3->width = raster->width;
    pIVar3->height = raster->height;
    if (!bVar5) {
      return pIVar3;
    }
    Raster::unlock(raster,0);
    return pIVar3;
  }
  _e.plugin = 0;
  _e.code = 0;
  uVar2 = raster->format & 0xf00;
  if (uVar2 == 0x100) {
    image._4_4_ = 0x10;
    _e = (Error)conv_ARGB1555_from_ARGB1555;
  }
  else {
    if (((uVar2 == 0x200) || (uVar2 == 0x300)) || (uVar2 == 0x400)) {
LAB_00120d8f:
      local_58 = 0xb00;
      pallength = -0x7ffffff6;
      fprintf(_stderr,"%s:%d: ",
              "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/d3d/d3d.cpp",0x38e)
      ;
      __stream = _stderr;
      pcVar4 = dbgsprint(0x8000000a);
      fprintf(__stream,"%s\n",pcVar4);
      setError((Error *)&stack0xffffffffffffffa8);
      return (Image *)0x0;
    }
    if (uVar2 == 0x500) {
      image._4_4_ = 0x20;
      _e = (Error)conv_RGBA8888_from_BGRA8888;
    }
    else if (uVar2 == 0x600) {
      image._4_4_ = 0x18;
      _e = (Error)conv_RGB888_from_BGR888;
    }
    else {
      if (uVar2 != 0xa00) goto LAB_00120d8f;
      image._4_4_ = 0x10;
      _e = (Error)conv_ARGB1555_from_RGB555;
    }
  }
  in._4_4_ = 0;
  if ((raster->format & 0x4000U) == 0x4000) {
    image._4_4_ = 4;
    in._4_4_ = 0x10;
  }
  else if ((raster->format & 0x2000U) == 0x2000) {
    image._4_4_ = 8;
    in._4_4_ = 0x100;
  }
  pIVar3 = Image::create(raster->width,raster->height,image._4_4_);
  Image::allocate(pIVar3);
  if (in._4_4_ != 0) {
    puStack_70 = pIVar3->palette;
    out = *(uint8 **)((long)&raster->flags + (long)iVar1);
    for (imgpixels._4_4_ = 0; imgpixels._4_4_ < in._4_4_; imgpixels._4_4_ = imgpixels._4_4_ + 1) {
      conv_RGBA8888_from_RGBA8888(puStack_70,out);
      out = out + 4;
      puStack_70 = puStack_70 + 4;
    }
  }
  pixels = pIVar3->pixels;
  for (imgrow._0_4_ = 0; (int)imgrow < pIVar3->height; imgrow._0_4_ = (int)imgrow + 1) {
    rasrow = pixels;
    for (imgrow._4_4_ = 0; imgrow._4_4_ < pIVar3->width; imgrow._4_4_ = imgrow._4_4_ + 1) {
      (*(code *)_e)(rasrow);
      rasrow = rasrow + pIVar3->bpp;
    }
    pixels = pixels + pIVar3->stride;
  }
  Image::compressPalette(pIVar3);
  if (bVar5) {
    Raster::unlock(raster,0);
  }
  return pIVar3;
}

Assistant:

Image*
rasterToImage(Raster *raster)
{
	int32 depth;
	Image *image;

	bool unlock = false;
	if(raster->pixels == nil){
		raster->lock(0, Raster::LOCKREAD);
		unlock = true;
	}

	D3dRaster *natras = GETD3DRASTEREXT(raster);
	if(natras->customFormat){
		int w = raster->width;
		int h = raster->height;
		// pixels are in the upper right corner
		if(w < 4) w = 4;
		if(h < 4) h = 4;
		image = Image::create(w, h, 32);
		image->allocate();
		uint8 *pix = raster->pixels;
		switch(natras->format){
		case D3DFMT_DXT1:
			image->setPixelsDXT(1, pix);
			if((raster->format & 0xF00) == Raster::C565)
				image->removeMask();
			break;
		case D3DFMT_DXT3:
			image->setPixelsDXT(3, pix);
			break;
		case D3DFMT_DXT5:
			image->setPixelsDXT(5, pix);
			break;
		default:
			image->destroy();
			if(unlock)
				raster->unlock(0);
			return nil;
		}
		// fix it up again
		image->width = raster->width;
		image->height = raster->height;

		if(unlock)
			raster->unlock(0);
		return image;
	}

	void (*conv)(uint8 *out, uint8 *in) = nil;
	switch(raster->format & 0xF00){
	case Raster::C1555:
		depth = 16;
		conv = conv_ARGB1555_from_ARGB1555;
		break;
	case Raster::C8888:
		depth = 32;
		conv = conv_RGBA8888_from_BGRA8888;
		break;
	case Raster::C888:
		depth = 24;
		conv = conv_RGB888_from_BGR888;
		break;
	case Raster::C555:
		depth = 16;
		conv = conv_ARGB1555_from_RGB555;
		break;

	default:
	case Raster::C565:
	case Raster::C4444:
	case Raster::LUM8:
		RWERROR((ERR_INVRASTER));
		return nil;
	}
	int32 pallength = 0;
	if((raster->format & Raster::PAL4) == Raster::PAL4){
		depth = 4;
		pallength = 16;
	}else if((raster->format & Raster::PAL8) == Raster::PAL8){
		depth = 8;
		pallength = 256;
	}

	uint8 *in, *out;
	image = Image::create(raster->width, raster->height, depth);
	image->allocate();

	if(pallength){
		out = image->palette;
		in = (uint8*)natras->palette;
		for(int32 i = 0; i < pallength; i++){
			conv_RGBA8888_from_RGBA8888(out, in);
			in += 4;
			out += 4;
		}
	}

	uint8 *imgpixels = image->pixels;
	uint8 *pixels = raster->pixels;

	int x, y;
	assert(image->width == raster->width);
	assert(image->height == raster->height);
	for(y = 0; y < image->height; y++){
		uint8 *imgrow = imgpixels;
		uint8 *rasrow = pixels;
		for(x = 0; x < image->width; x++){
			conv(imgrow, rasrow);
			imgrow += image->bpp;
			rasrow += natras->bpp;
		}
		imgpixels += image->stride;
		pixels += raster->stride;
	}
	image->compressPalette();

	if(unlock)
		raster->unlock(0);

	return image;
}